

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4afdb9::NameType::printLeft(NameType *this,OutputStream *s)

{
  OutputStream::operator+=(s,this->Name);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override { s += Name; }